

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O3

void traverseAbstractSyntaxTree_postFix(ltlNode *node)

{
  ltlNode_t *node_00;
  char *__format;
  
  switch(node->type) {
  case AND:
    printf("( ");
    node_00 = node->left;
    if (node_00 == (ltlNode_t *)0x0) {
      __assert_fail("node->left != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                    ,0x1b9,"void traverseAbstractSyntaxTree_postFix(ltlNode *)");
    }
    if (node->right == (ltlNode_t *)0x0) {
      __assert_fail("node->right != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                    ,0x1ba,"void traverseAbstractSyntaxTree_postFix(ltlNode *)");
    }
    __format = "& ";
    goto LAB_0063943b;
  case OR:
    printf("( ");
    node_00 = node->left;
    if (node_00 == (ltlNode_t *)0x0) {
      __assert_fail("node->left != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                    ,0x1c2,"void traverseAbstractSyntaxTree_postFix(ltlNode *)");
    }
    if (node->right == (ltlNode_t *)0x0) {
      __assert_fail("node->right != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                    ,0x1c3,"void traverseAbstractSyntaxTree_postFix(ltlNode *)");
    }
    __format = "+ ";
    goto LAB_0063943b;
  case NOT:
    printf("~ ");
    if (node->left == (ltlNode *)0x0) {
      __assert_fail("node->left != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                    ,0x1cb,"void traverseAbstractSyntaxTree_postFix(ltlNode *)");
    }
    traverseAbstractSyntaxTree_postFix(node->left);
    if (node->right != (ltlNode_t *)0x0) {
      __assert_fail("node->right == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                    ,0x1cd,"void traverseAbstractSyntaxTree_postFix(ltlNode *)");
    }
    break;
  default:
    puts("\nUnsupported token type: Exiting execution");
    exit(0);
  case GLOBALLY:
    printf("G ");
    if (node->left == (ltlNode *)0x0) {
      __assert_fail("node->left != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                    ,0x1d2,"void traverseAbstractSyntaxTree_postFix(ltlNode *)");
    }
    traverseAbstractSyntaxTree_postFix(node->left);
    if (node->right != (ltlNode_t *)0x0) {
      __assert_fail("node->right == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                    ,0x1d4,"void traverseAbstractSyntaxTree_postFix(ltlNode *)");
    }
    break;
  case EVENTUALLY:
    printf("F ");
    if (node->left == (ltlNode *)0x0) {
      __assert_fail("node->left != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                    ,0x1da,"void traverseAbstractSyntaxTree_postFix(ltlNode *)");
    }
    traverseAbstractSyntaxTree_postFix(node->left);
    if (node->right != (ltlNode_t *)0x0) {
      __assert_fail("node->right == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                    ,0x1dc,"void traverseAbstractSyntaxTree_postFix(ltlNode *)");
    }
    break;
  case NEXT:
    printf("X ");
    if (node->left == (ltlNode *)0x0) {
      __assert_fail("node->left != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                    ,0x1e1,"void traverseAbstractSyntaxTree_postFix(ltlNode *)");
    }
    traverseAbstractSyntaxTree_postFix(node->left);
    if (node->right != (ltlNode_t *)0x0) {
      __assert_fail("node->right == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                    ,0x1e3,"void traverseAbstractSyntaxTree_postFix(ltlNode *)");
    }
    break;
  case UNTIL:
    printf("( ");
    node_00 = node->left;
    if (node_00 == (ltlNode_t *)0x0) {
      __assert_fail("node->left != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                    ,0x1e7,"void traverseAbstractSyntaxTree_postFix(ltlNode *)");
    }
    if (node->right == (ltlNode_t *)0x0) {
      __assert_fail("node->right != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                    ,0x1e8,"void traverseAbstractSyntaxTree_postFix(ltlNode *)");
    }
    __format = "U ";
LAB_0063943b:
    traverseAbstractSyntaxTree_postFix(node_00);
    printf(__format);
    traverseAbstractSyntaxTree_postFix(node->right);
    printf(") ");
    return;
  case BOOL:
    printf("%s ",node->name);
    if (node->left != (ltlNode_t *)0x0) {
      __assert_fail("node->left == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                    ,0x1f0,"void traverseAbstractSyntaxTree_postFix(ltlNode *)");
    }
    if (node->right != (ltlNode_t *)0x0) {
      __assert_fail("node->right == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/ltl_parser.c"
                    ,0x1f1,"void traverseAbstractSyntaxTree_postFix(ltlNode *)");
    }
  }
  return;
}

Assistant:

void traverseAbstractSyntaxTree_postFix( ltlNode *node )
{
    switch(node->type){
        case( AND ):
            printf("( ");
            assert( node->left != NULL );
            assert( node->right != NULL );
            traverseAbstractSyntaxTree_postFix( node->left );
            printf("& ");
            traverseAbstractSyntaxTree_postFix( node->right );
            printf(") ");
            return;
        case( OR ):
            printf("( ");
            assert( node->left != NULL );
            assert( node->right != NULL );
            traverseAbstractSyntaxTree_postFix( node->left );
            printf("+ ");
            traverseAbstractSyntaxTree_postFix( node->right );
            printf(") ");
            return;
        case( NOT ):
            printf("~ ");
            assert( node->left != NULL );
            traverseAbstractSyntaxTree_postFix( node->left );
            assert( node->right == NULL );
            return;
        case( GLOBALLY ):
            printf("G ");
            //printf("( ");
            assert( node->left != NULL );
            traverseAbstractSyntaxTree_postFix( node->left );
            assert( node->right == NULL );
            //printf(") ");
            return;
        case( EVENTUALLY ):
            printf("F ");
            //printf("( ");
            assert( node->left != NULL );
            traverseAbstractSyntaxTree_postFix( node->left );
            assert( node->right == NULL );
            //printf(") ");
            return;
        case( NEXT ):
            printf("X ");
            assert( node->left != NULL );
            traverseAbstractSyntaxTree_postFix( node->left );
            assert( node->right == NULL );
            return;
        case( UNTIL ):
            printf("( ");
            assert( node->left != NULL );
            assert( node->right != NULL );
            traverseAbstractSyntaxTree_postFix( node->left );
            printf("U ");
            traverseAbstractSyntaxTree_postFix( node->right );
            printf(") ");
            return;
        case( BOOL ):
            printf("%s ", node->name);
            assert( node->left == NULL );
            assert( node->right == NULL );
            return;
        default:
            printf("\nUnsupported token type: Exiting execution\n");
            exit(0);
    }
}